

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltc.cpp
# Opt level: O3

void __thiscall ltc::ltc(ltc *this)

{
  (this->super_brdf)._vptr_brdf = (_func_int **)&PTR__brdf_001c99e0;
  this->_amplitude = 1.0;
  *(undefined8 *)&this->_ltc_matrix_inv_determinant = 0x3f8000003f800000;
  *(undefined8 *)((long)&(this->_base_frame).value[0].field_0 + 4) = 0;
  *(undefined8 *)&(this->_base_frame).value[1].field_0 = 0x3f80000000000000;
  *(undefined8 *)((long)&(this->_base_frame).value[1].field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->_base_frame).value[2].field_0 + 4) = 0x3f80000000000000;
  *(undefined8 *)&(this->_ltc_matrix).value[0].field_0 = 0x3f800000;
  *(undefined8 *)((long)&(this->_ltc_matrix).value[0].field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->_ltc_matrix).value[1].field_0 + 4) = 0x3f800000;
  *(undefined8 *)&(this->_ltc_matrix).value[2].field_0 = 0;
  *(undefined8 *)((long)&(this->_ltc_matrix).value[2].field_0 + 8) = 0x3f8000003f800000;
  *(undefined8 *)((long)&(this->_ltc_matrix_inv).value[0].field_0 + 4) = 0;
  *(undefined8 *)&(this->_ltc_matrix_inv).value[1].field_0 = 0x3f80000000000000;
  *(undefined8 *)((long)&(this->_ltc_matrix_inv).value[1].field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->_ltc_matrix_inv).value[2].field_0 + 4) = 0x3f80000000000000;
  return;
}

Assistant:

ltc::ltc():
  _amplitude{1.0f},
  _ltc_matrix{},
  _ltc_matrix_inv{},
  _ltc_matrix_inv_determinant{1.0f}
{
}